

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

bool __thiscall
llama_kv_cache_unified::state_read_data
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count)

{
  ggml_type gVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  ggml_type gVar4;
  llama_io_read_i *plVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  undefined4 uVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  uint32_t j;
  uint uVar17;
  int32_t k_type_i_ref;
  uint32_t n_layer;
  uint64_t k_size_row_ref;
  uint32_t v_trans;
  uint32_t n_embd_v_gqa_ref;
  ggml_type local_90;
  uint local_8c;
  llama_kv_cache_unified *local_88;
  undefined4 local_7c;
  ulong local_78;
  ggml_tensor *local_70;
  ggml_type local_68;
  undefined4 uStack_64;
  uint local_60;
  uint32_t local_5c;
  uint local_58;
  uint local_54;
  llama_io_read_i *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  (*io->_vptr_llama_io_read_i[3])(io,&local_60,4);
  (*io->_vptr_llama_io_read_i[3])(io,&local_8c,4);
  uVar15 = (ulong)local_8c;
  if (local_8c == this->hparams->n_layer) {
    if (cell_count <= this->size) {
      if (1 < local_60) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: incompatible V transposition\n",
                           "state_read_data");
        return false;
      }
      local_88 = this;
      if (local_8c != 0) {
        local_78 = (ulong)cell_count;
        uVar15 = 0;
        do {
          uVar6 = llama_hparams::n_embd_k_gqa(this->hparams,(uint32_t)uVar15);
          uVar7 = llama_hparams::n_embd_k_s(this->hparams);
          (*io->_vptr_llama_io_read_i[3])(io,&local_90,4);
          gVar1 = (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar15]->type;
          if (gVar1 != local_90) {
            pcVar14 = "%s: mismatched key type (%d != %d, layer %d)\n";
            goto LAB_001b1e08;
          }
          (*io->_vptr_llama_io_read_i[3])(io,&local_68,8);
          lVar10 = ggml_row_size((this->k_l).
                                 super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                 uVar7 + uVar6);
          lVar3 = CONCAT44(uStack_64,local_68);
          if (lVar10 == lVar3) {
            if (cell_count != 0) {
              local_70 = (this->k_l).
                         super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
              lVar16 = lVar10 * local_78;
              iVar8 = (*io->_vptr_llama_io_read_i[2])(io,lVar16);
              this = local_88;
              ggml_backend_tensor_set(local_70,iVar8,(ulong)local_88->head * lVar10,lVar16);
            }
          }
          else {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched key row size (%zu != %zu, layer %d)\n",
                               "state_read_data",lVar10,lVar3,uVar15 & 0xffffffff);
          }
          if (lVar10 != lVar3) {
            return false;
          }
          uVar15 = uVar15 + 1;
        } while ((uint)uVar15 < local_8c);
      }
      if (local_60 == 0) {
        if (local_8c != 0) {
          local_78 = (ulong)cell_count;
          uVar15 = 0;
          while( true ) {
            uVar6 = llama_hparams::n_embd_v_gqa(this->hparams,(uint32_t)uVar15);
            uVar7 = llama_hparams::n_embd_v_s(this->hparams);
            (*io->_vptr_llama_io_read_i[3])(io,&local_90,4);
            gVar1 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15]->type;
            gVar4 = local_90;
            if (gVar1 != local_90) break;
            (*io->_vptr_llama_io_read_i[3])(io,&local_68,8);
            lVar10 = ggml_row_size((this->v_l).
                                   super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                   uVar7 + uVar6);
            lVar3 = CONCAT44(uStack_64,local_68);
            uVar13 = CONCAT31((int3)(uVar6 >> 8),lVar10 == lVar3);
            if (lVar10 == lVar3) {
              if (cell_count != 0) {
                local_70 = (local_88->v_l).
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar15];
                lVar16 = lVar10 * local_78;
                local_7c = uVar13;
                iVar8 = (*io->_vptr_llama_io_read_i[2])(io,lVar16);
                uVar13 = local_7c;
                ggml_backend_tensor_set(local_70,iVar8,(ulong)local_88->head * lVar10,lVar16);
              }
            }
            else {
              llama_log_internal(GGML_LOG_LEVEL_ERROR,
                                 "%s: mismatched value row size (%zu != %zu, layer %d)\n",
                                 "state_read_data",lVar10,lVar3,uVar15 & 0xffffffff);
            }
            if (lVar10 != lVar3) {
              return (bool)(char)uVar13;
            }
            uVar15 = uVar15 + 1;
            this = local_88;
            if (local_8c <= (uint)uVar15) {
              return (bool)(char)uVar13;
            }
          }
          goto LAB_001b1e01;
        }
      }
      else if (local_8c != 0) {
        local_48 = (ulong)cell_count;
        uVar12 = 0;
        local_5c = cell_count;
        local_50 = io;
        while( true ) {
          plVar5 = local_50;
          uVar6 = local_5c;
          uVar7 = llama_hparams::n_embd_v_gqa(this->hparams,uVar12);
          uVar9 = llama_hparams::n_embd_v_s(this->hparams);
          (*plVar5->_vptr_llama_io_read_i[3])(plVar5,&local_68,4);
          uVar15 = (ulong)uVar12;
          gVar1 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar15]->type;
          gVar4 = local_68;
          if (gVar1 != local_68) break;
          (*plVar5->_vptr_llama_io_read_i[3])(plVar5,&local_90,4);
          uVar11 = ggml_type_size((this->v_l).
                                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15]->type);
          if (uVar11 != local_90) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched value element size (%zu != %zu, layer %d)\n",
                               "state_read_data",uVar11,(ulong)local_90,uVar15);
            return false;
          }
          uVar12 = uVar9 + uVar7;
          local_40 = uVar11;
          iVar8 = (*plVar5->_vptr_llama_io_read_i[3])(plVar5,&local_54,4);
          uVar11 = local_40;
          plVar5 = local_50;
          local_7c = CONCAT31((int3)((uint)iVar8 >> 8),uVar12 == local_54);
          local_58 = local_54;
          if (uVar12 == local_54) {
            if ((uVar6 != 0) && (uVar12 != 0)) {
              local_38 = local_40 * local_48;
              uVar17 = 0;
              local_70 = (ggml_tensor *)CONCAT44(local_70._4_4_,uVar12);
              local_78 = uVar15;
              do {
                lVar3 = local_38;
                uVar6 = local_88->size;
                uVar7 = local_88->head;
                pgVar2 = (local_88->v_l).
                         super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                         super__Vector_impl_data._M_start[local_78];
                iVar8 = (*plVar5->_vptr_llama_io_read_i[2])(plVar5,local_38);
                this = local_88;
                uVar12 = (uint)local_70;
                ggml_backend_tensor_set(pgVar2,iVar8,(uVar6 * uVar17 + uVar7) * uVar11,lVar3);
                uVar17 = uVar17 + 1;
                uVar15 = local_78;
              } while (uVar12 != uVar17);
            }
          }
          else {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: mismatched GQA embedding size (%u != %u, layer %d)\n",
                               "state_read_data",(ulong)uVar12,(ulong)local_54,uVar15);
          }
          if (uVar12 != local_58) {
            return (bool)(char)local_7c;
          }
          uVar12 = (int)uVar15 + 1;
          if (local_8c <= uVar12) {
            return (bool)(char)local_7c;
          }
        }
LAB_001b1e01:
        pcVar14 = "%s: mismatched value type (%d != %d, layer %d)\n";
        local_90 = gVar4;
LAB_001b1e08:
        llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar14,"state_read_data",(ulong)gVar1,
                           (ulong)local_90,uVar15 & 0xffffffff);
        return false;
      }
      return true;
    }
    pcVar14 = "%s: not enough cells in kv cache to restore state (%u > %u)\n";
    uVar15 = (ulong)cell_count;
  }
  else {
    pcVar14 = "%s: mismatched layer count (%u instead of %u)\n";
  }
  llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar14,"state_read_data",uVar15);
  return false;
}

Assistant:

bool llama_kv_cache_unified::state_read_data(llama_io_read_i & io, uint32_t cell_count) {
    uint32_t v_trans;
    uint32_t n_layer;
    io.read_to(&v_trans, sizeof(v_trans));
    io.read_to(&n_layer, sizeof(n_layer));

    if (n_layer != hparams.n_layer) {
        LLAMA_LOG_ERROR("%s: mismatched layer count (%u instead of %u)\n", __func__, n_layer, hparams.n_layer);
        return false;
    }
    if (cell_count > size) {
        LLAMA_LOG_ERROR("%s: not enough cells in kv cache to restore state (%u > %u)\n", __func__, cell_count, size);
        return false;
    }
    if (v_trans != (bool) v_trans) {
        LLAMA_LOG_ERROR("%s: incompatible V transposition\n", __func__);
        return false;
    }

    // For each layer, read the keys for each cell, one row is one cell, read as one contiguous block
    for (uint32_t il = 0; il < n_layer; ++il) {
        const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa(il) + hparams.n_embd_k_s();

        // Read type of key
        int32_t k_type_i_ref;
        io.read_to(&k_type_i_ref, sizeof(k_type_i_ref));
        const int32_t k_type_i = (int32_t) k_l[il]->type;
        if (k_type_i != k_type_i_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key type (%d != %d, layer %d)\n", __func__, k_type_i, k_type_i_ref, il);
            return false;
        }

        // Read row size of key
        uint64_t k_size_row_ref;
        io.read_to(&k_size_row_ref, sizeof(k_size_row_ref));
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        if (k_size_row != k_size_row_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key row size (%zu != %zu, layer %d)\n", __func__, k_size_row, (size_t) k_size_row_ref, il);
            return false;
        }

        if (cell_count) {
            // Read and set the keys for the whole cell range
            ggml_backend_tensor_set(k_l[il], io.read(cell_count * k_size_row), head * k_size_row, cell_count * k_size_row);
        }
    }

    if (!v_trans) {
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read row size of value
            uint64_t v_size_row_ref;
            io.read_to(&v_size_row_ref, sizeof(v_size_row_ref));
            const size_t v_size_row = ggml_row_size(v_l[il]->type, n_embd_v_gqa);
            if (v_size_row != v_size_row_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value row size (%zu != %zu, layer %d)\n", __func__, v_size_row, (size_t) v_size_row_ref, il);
                return false;
            }

            if (cell_count) {
                // Read and set the values for the whole cell range
                ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_row), head * v_size_row, cell_count * v_size_row);
            }
        }
    } else {
        // For each layer, read the values for each cell (transposed)
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read element size of value
            uint32_t v_size_el_ref;
            io.read_to(&v_size_el_ref, sizeof(v_size_el_ref));
            const size_t v_size_el = ggml_type_size(v_l[il]->type);
            if (v_size_el != v_size_el_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value element size (%zu != %zu, layer %d)\n", __func__, v_size_el, (size_t) v_size_el_ref, il);
                return false;
            }

            // Read GQA embedding size
            uint32_t n_embd_v_gqa_ref;
            io.read_to(&n_embd_v_gqa_ref, sizeof(n_embd_v_gqa_ref));
            if (n_embd_v_gqa != n_embd_v_gqa_ref) {
                LLAMA_LOG_ERROR("%s: mismatched GQA embedding size (%u != %u, layer %d)\n", __func__, n_embd_v_gqa, n_embd_v_gqa_ref, il);
                return false;
            }

            if (cell_count) {
                // For each row in the transposed matrix, read the values for the whole cell range
                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    const size_t dst_offset = (head + j * size) * v_size_el;
                    ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_el), dst_offset, cell_count * v_size_el);
                }
            }
        }
    }

    return true;
}